

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  ulong *puVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  char cVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *puVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  ulong *puVar16;
  int *piVar17;
  ulong *puVar18;
  ulong *puVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  char cVar28;
  ulong *puVar29;
  ulong *puVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  ulong *puVar34;
  ulong *puVar35;
  BYTE *e;
  long lVar36;
  ulong *puVar37;
  int iVar38;
  int *piVar39;
  int *piVar40;
  BYTE *s;
  bool bVar41;
  U32 *hashTable;
  ulong *local_d0;
  int local_60;
  
  piVar40 = (int *)(ulong)(uint)srcSize;
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  uVar22 = (LZ4_dict->internal_donotuse).dictSize;
  uVar24 = (ulong)uVar22;
  local_d0 = (ulong *)dest;
  puVar9 = (ulong *)source;
  if (uVar24 < 0x10000) {
    uVar3 = (LZ4_dict->internal_donotuse).currentOffset;
    if (uVar3 <= uVar22) goto LAB_0011347a;
    if ((uint)srcSize < 0x7e000001) {
      if (srcSize != 0) {
        piVar17 = (int *)(LZ4_dict->internal_donotuse).dictionary;
        lVar32 = uVar24 + (long)piVar17;
        pcVar12 = (char *)((long)piVar40 + (long)source);
        lVar13 = lVar32 - (ulong)uVar3;
        if (piVar17 == (int *)0x0) {
          lVar13 = 0;
        }
        (LZ4_dict->internal_donotuse).dictSize = uVar22 + srcSize;
        (LZ4_dict->internal_donotuse).currentOffset = uVar3 + srcSize;
        (LZ4_dict->internal_donotuse).tableType = 2;
        if (0xc < srcSize) {
          lVar14 = (long)source - (ulong)uVar3;
          puVar8 = (ulong *)((char *)((long)piVar40 + (long)source) + -5);
          if (piVar17 == (int *)0x0) {
            lVar32 = 0;
          }
          *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
               uVar3;
          puVar30 = (ulong *)(source + 1);
          uVar24 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          puVar1 = (ulong *)(pcVar12 + -0xc);
          iVar21 = 0;
          piVar39 = (int *)source;
          piVar15 = piVar40;
          do {
            uVar20 = 0x40;
            uVar27 = 1;
            while( true ) {
              puVar29 = (ulong *)((ulong)uVar27 + (long)puVar30);
              iVar38 = (int)lVar14;
              if ((char *)((long)piVar40 + (long)source) + -0xb < puVar29) {
                iVar26 = 2;
              }
              else {
                uVar31 = (int)puVar30 - iVar38;
                uVar27 = *(uint *)((long)LZ4_dict + uVar24 * 4);
                lVar6 = lVar14;
                if (uVar27 < uVar3) {
                  lVar6 = lVar13;
                }
                piVar15 = (int *)((ulong)uVar27 + lVar6);
                piVar39 = (int *)source;
                if (uVar27 < uVar3) {
                  piVar39 = piVar17;
                }
                uVar25 = *puVar29 * -0x30e4432345000000 >> 0x34;
                *(uint *)((long)LZ4_dict + uVar24 * 4) = uVar31;
                iVar26 = 8;
                uVar24 = uVar25;
                if ((uVar3 - uVar22 <= uVar27) && (uVar31 <= uVar27 + 0xffff)) {
                  if (*piVar15 == (int)*puVar30) {
                    iVar21 = uVar31 - uVar27;
                    iVar26 = 7;
                  }
                  else {
                    iVar26 = 0;
                  }
                }
              }
              if ((iVar26 != 0) && (iVar26 != 8)) break;
              uVar27 = uVar20 >> 6;
              uVar20 = uVar20 + 1;
              puVar30 = puVar29;
            }
            if (iVar26 == 7) {
              iVar26 = 0;
            }
            if (iVar26 == 0) {
              iVar26 = (int)puVar30 - (int)puVar9;
              lVar6 = 0;
              uVar20 = iVar26 - 0xfU;
              cVar7 = (char)puVar30 * '\x10' + (char)puVar9 * -0x10;
              do {
                cVar28 = cVar7;
                uVar27 = uVar20;
                lVar36 = lVar6;
                piVar2 = (int *)((long)piVar15 + lVar36);
                puVar29 = (ulong *)((long)puVar30 + lVar36);
                if ((piVar2 <= piVar39) || (puVar29 <= puVar9)) break;
                lVar6 = lVar36 + -1;
                uVar20 = uVar27 - 1;
                cVar7 = cVar28 + -0x10;
              } while (*(char *)((long)puVar30 + lVar36 + -1) ==
                       *(char *)((long)piVar15 + lVar36 + -1));
              iVar5 = (int)lVar36;
              puVar30 = (ulong *)((long)local_d0 + 1);
              if ((uint)(iVar26 + iVar5) < 0xf) {
                *(char *)local_d0 = cVar28;
              }
              else {
                uVar25 = (ulong)(iVar26 - 0xfU) + lVar36;
                *(char *)local_d0 = -0x10;
                if (0xfe < (int)uVar25) {
                  if (0x1fc < (int)uVar27) {
                    uVar27 = 0x1fd;
                  }
                  uVar20 = (iVar26 - uVar27) + iVar5 + 0xef;
                  uVar25 = (ulong)uVar20 / 0xff;
                  memset(puVar30,0xff,(ulong)(uVar20 / 0xff + 1));
                  puVar30 = (ulong *)((long)local_d0 + uVar25 + 2);
                  uVar25 = (ulong)(uint)(iVar26 + -0x10e + iVar5 + (int)uVar25 * -0xff);
                }
                *(char *)puVar30 = (char)uVar25;
                puVar30 = (ulong *)((long)puVar30 + 1);
              }
              puVar37 = (ulong *)((ulong)(uint)((int)puVar29 - (int)puVar9) + (long)puVar30);
              do {
                *puVar30 = *puVar9;
                puVar30 = puVar30 + 1;
                puVar9 = puVar9 + 1;
                piVar15 = piVar2;
              } while (puVar30 < puVar37);
              do {
                *(short *)puVar37 = (short)iVar21;
                if (piVar39 == piVar17) {
                  puVar9 = (ulong *)((lVar32 - (long)piVar15) + (long)puVar29);
                  if (puVar8 < puVar9) {
                    puVar9 = puVar8;
                  }
                  puVar30 = (ulong *)((long)puVar29 + 4);
                  puVar10 = (ulong *)(piVar15 + 1);
                  puVar16 = puVar30;
                  puVar34 = puVar10;
                  if (puVar30 < (ulong *)((long)puVar9 - 7U)) {
                    uVar23 = *(ulong *)((long)puVar29 + 4) ^ *(ulong *)(piVar15 + 1);
                    uVar25 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar25 = uVar25 >> 3 & 0x1fffffff;
                    puVar16 = (ulong *)((long)puVar29 + 0xc);
                    puVar34 = (ulong *)(piVar15 + 3);
                    if (*(ulong *)(piVar15 + 1) == *(ulong *)((long)puVar29 + 4)) goto LAB_001130d6;
                  }
                  else {
LAB_001130d6:
                    do {
                      puVar10 = puVar34;
                      if ((ulong *)((long)puVar9 - 7U) <= puVar16) {
                        if ((puVar16 < (ulong *)((long)puVar9 - 3U)) &&
                           ((int)*puVar10 == (int)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 4);
                          puVar10 = (ulong *)((long)puVar10 + 4);
                        }
                        if ((puVar16 < (ulong *)((long)puVar9 - 1U)) &&
                           ((short)*puVar10 == (short)*puVar16)) {
                          puVar16 = (ulong *)((long)puVar16 + 2);
                          puVar10 = (ulong *)((long)puVar10 + 2);
                        }
                        if (puVar16 < puVar9) {
                          uVar25 = *puVar10;
                          puVar10 = (ulong *)CONCAT71((int7)((ulong)puVar10 >> 8),(char)uVar25);
                          puVar16 = (ulong *)((long)puVar16 +
                                             (ulong)((char)uVar25 == (char)*puVar16));
                        }
                        uVar25 = (ulong)(uint)((int)puVar16 - (int)puVar30);
                        goto LAB_00113116;
                      }
                      uVar25 = *puVar10;
                      uVar23 = *puVar16;
                      uVar33 = uVar23 ^ uVar25;
                      uVar4 = 0;
                      if (uVar33 != 0) {
                        for (; (uVar33 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      iVar26 = (int)puVar16;
                      puVar10 = puVar10 + 1;
                      puVar16 = puVar16 + 1;
                      puVar34 = puVar10;
                    } while (uVar25 == uVar23);
                    uVar25 = (ulong)((((uint)(uVar4 >> 3) & 0x1fffffff) + iVar26) - (int)puVar30);
                  }
LAB_00113116:
                  puVar29 = (ulong *)((long)puVar29 + uVar25 + 4);
                  if (puVar29 == puVar9) {
                    puVar16 = puVar9;
                    puVar30 = (ulong *)source;
                    if (puVar9 < puVar1) {
                      uVar23 = *(ulong *)source;
                      uVar4 = *puVar9;
                      uVar33 = 0;
                      if ((uVar4 ^ uVar23) != 0) {
                        for (; ((uVar4 ^ uVar23) >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                        }
                      }
                      puVar10 = (ulong *)(uVar33 >> 3 & 0x1fffffff);
                      uVar20 = (uint)puVar10;
                      if (uVar23 == uVar4) {
                        puVar30 = (ulong *)(source + (ulong)(uVar23 == uVar4) * 8);
                        puVar16 = puVar9 + (uVar23 == uVar4);
                        goto LAB_00113161;
                      }
                    }
                    else {
LAB_00113161:
                      do {
                        if (puVar1 <= puVar16) {
                          if ((puVar16 < pcVar12 + -8) && ((int)*puVar30 == (int)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 4);
                            puVar30 = (ulong *)((long)puVar30 + 4);
                          }
                          if ((puVar16 < pcVar12 + -6) && ((short)*puVar30 == (short)*puVar16)) {
                            puVar16 = (ulong *)((long)puVar16 + 2);
                            puVar30 = (ulong *)((long)puVar30 + 2);
                          }
                          if (puVar16 < puVar8) {
                            puVar16 = (ulong *)((long)puVar16 +
                                               (ulong)((char)*puVar30 == (char)*puVar16));
                          }
                          uVar20 = (int)puVar16 - (int)puVar9;
                          break;
                        }
                        uVar23 = *puVar30;
                        uVar33 = *puVar16 ^ uVar23;
                        uVar4 = 0;
                        if (uVar33 != 0) {
                          for (; (uVar33 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                          }
                        }
                        puVar34 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar16);
                        puVar30 = puVar30 + 1;
                        bVar41 = uVar23 == *puVar16;
                        puVar16 = puVar16 + 1;
                        if (!bVar41) {
                          puVar16 = puVar34;
                        }
                        puVar10 = (ulong *)((ulong)puVar10 & 0xffffffff);
                        if (!bVar41) {
                          puVar10 = (ulong *)(ulong)(uint)((int)puVar34 - (int)puVar9);
                        }
                        uVar20 = (uint)puVar10;
                      } while (bVar41);
                    }
                    uVar25 = (ulong)((int)uVar25 + uVar20);
                    puVar29 = (ulong *)((long)puVar29 + (ulong)uVar20);
                  }
                }
                else {
                  puVar9 = (ulong *)((long)puVar29 + 4);
                  puVar30 = (ulong *)(piVar15 + 1);
                  puVar10 = puVar9;
                  if (puVar9 < puVar1) {
                    uVar23 = *(ulong *)((long)puVar29 + 4) ^ *(ulong *)(piVar15 + 1);
                    uVar25 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar25 = uVar25 >> 3 & 0x1fffffff;
                    puVar10 = (ulong *)((long)puVar29 + 0xc);
                    puVar30 = (ulong *)(piVar15 + 3);
                    if (*(ulong *)(piVar15 + 1) == *(ulong *)((long)puVar29 + 4)) goto LAB_00113032;
                  }
                  else {
LAB_00113032:
                    do {
                      if (puVar1 <= puVar10) {
                        if ((puVar10 < pcVar12 + -8) && ((int)*puVar30 == (int)*puVar10)) {
                          puVar10 = (ulong *)((long)puVar10 + 4);
                          puVar30 = (ulong *)((long)puVar30 + 4);
                        }
                        if ((puVar10 < pcVar12 + -6) && ((short)*puVar30 == (short)*puVar10)) {
                          puVar10 = (ulong *)((long)puVar10 + 2);
                          puVar30 = (ulong *)((long)puVar30 + 2);
                        }
                        if (puVar10 < puVar8) {
                          puVar10 = (ulong *)((long)puVar10 +
                                             (ulong)((char)*puVar30 == (char)*puVar10));
                        }
                        uVar25 = (ulong)(uint)((int)puVar10 - (int)puVar9);
                        goto LAB_0011306d;
                      }
                      uVar25 = *puVar30;
                      uVar23 = *puVar10;
                      uVar33 = uVar23 ^ uVar25;
                      uVar4 = 0;
                      if (uVar33 != 0) {
                        for (; (uVar33 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      iVar26 = (int)puVar10;
                      puVar30 = puVar30 + 1;
                      puVar10 = puVar10 + 1;
                    } while (uVar25 == uVar23);
                    uVar25 = (ulong)((((uint)(uVar4 >> 3) & 0x1fffffff) + iVar26) - (int)puVar9);
                  }
LAB_0011306d:
                  puVar29 = (ulong *)((long)puVar29 + uVar25 + 4);
                }
                puVar10 = (ulong *)((long)puVar37 + 2);
                uVar20 = (uint)uVar25;
                if (uVar20 < 0xf) {
                  *(char *)local_d0 = (char)*local_d0 + (char)uVar25;
                }
                else {
                  *(char *)local_d0 = (char)*local_d0 + '\x0f';
                  uVar27 = uVar20 - 0xf;
                  *(undefined4 *)puVar10 = 0xffffffff;
                  if (0x3fb < uVar27) {
                    uVar20 = uVar20 - 0x40b;
                    memset((char *)((long)puVar37 + 6),0xff,(ulong)((uVar20 / 0x3fc) * 4 + 4));
                    uVar27 = uVar20 % 0x3fc;
                    puVar10 = (ulong *)((long)puVar37 + (ulong)((uVar20 / 0x3fc) * 4) + 6);
                  }
                  pcVar11 = (char *)((long)puVar10 + (ulong)uVar27 / 0xff);
                  puVar10 = (ulong *)(pcVar11 + 1);
                  *pcVar11 = (char)((ulong)uVar27 * 0x8080808081 >> 0x27);
                }
                puVar9 = puVar29;
                if ((char *)((long)piVar40 + (long)source) + -0xb <= puVar29) {
                  iVar26 = 3;
                  puVar30 = puVar29;
                  local_d0 = puVar10;
                  goto LAB_0011344a;
                }
                *(int *)((long)LZ4_dict +
                        ((ulong)(*(long *)((long)puVar29 + -2) * -0x30e4432345000000) >> 0x34) * 4)
                     = ((int)puVar29 + -2) - iVar38;
                uVar25 = *puVar29 * -0x30e4432345000000 >> 0x34;
                uVar27 = (int)puVar29 - iVar38;
                uVar20 = *(uint *)((long)LZ4_dict + uVar25 * 4);
                lVar6 = lVar14;
                if (uVar20 < uVar3) {
                  lVar6 = lVar13;
                }
                piVar15 = (int *)((ulong)uVar20 + lVar6);
                piVar39 = (int *)source;
                if (uVar20 < uVar3) {
                  piVar39 = piVar17;
                }
                *(uint *)((long)LZ4_dict + uVar25 * 4) = uVar27;
                bVar41 = true;
                puVar37 = puVar10;
                if (((uVar3 - uVar22 <= uVar20) && (uVar27 <= uVar20 + 0xffff)) &&
                   (*piVar15 == (int)*puVar29)) {
                  *(char *)puVar10 = '\0';
                  iVar21 = uVar27 - uVar20;
                  bVar41 = false;
                  puVar37 = (ulong *)((long)puVar10 + 1);
                  local_d0 = puVar10;
                }
              } while (!bVar41);
              uVar24 = (ulong)(*(long *)((long)puVar29 + 1) * -0x30e4432345000000) >> 0x34;
              iVar26 = 0;
              puVar30 = (ulong *)((long)puVar29 + 1);
              local_d0 = puVar37;
            }
LAB_0011344a:
          } while (iVar26 == 0);
          goto joined_r0x00113c04;
        }
        goto LAB_00113c19;
      }
LAB_00113c8d:
      *dest = '\0';
      local_60 = 1;
      goto LAB_00113cb7;
    }
  }
  else {
LAB_0011347a:
    if ((uint)srcSize < 0x7e000001) {
      if (srcSize == 0) goto LAB_00113c8d;
      uVar3 = (LZ4_dict->internal_donotuse).currentOffset;
      piVar39 = (int *)(LZ4_dict->internal_donotuse).dictionary;
      lVar32 = uVar24 + (long)piVar39;
      piVar17 = (int *)((long)piVar40 + (long)source);
      lVar13 = lVar32 - (ulong)uVar3;
      if (piVar39 == (int *)0x0) {
        lVar13 = 0;
      }
      (LZ4_dict->internal_donotuse).dictSize = uVar22 + srcSize;
      (LZ4_dict->internal_donotuse).currentOffset = uVar3 + srcSize;
      (LZ4_dict->internal_donotuse).tableType = 2;
      if (0xc < srcSize) {
        lVar14 = (long)source - (ulong)uVar3;
        puVar8 = (ulong *)((char *)((long)piVar40 + (long)source) + -5);
        if (piVar39 == (int *)0x0) {
          lVar32 = 0;
        }
        *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar3;
        puVar30 = (ulong *)(source + 1);
        uVar24 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        puVar1 = (ulong *)(piVar17 + -3);
        puVar29 = (ulong *)(piVar17 + -2);
        puVar37 = (ulong *)((long)piVar17 - 6);
        iVar21 = 0;
        piVar15 = (int *)source;
        do {
          uVar22 = 0x40;
          uVar20 = 1;
          while( true ) {
            puVar10 = (ulong *)((ulong)uVar20 + (long)puVar30);
            iVar38 = (int)lVar14;
            if ((char *)((long)piVar40 + (long)source) + -0xb < puVar10) {
              iVar26 = 2;
            }
            else {
              uVar27 = (int)puVar30 - iVar38;
              uVar20 = *(uint *)((long)LZ4_dict + uVar24 * 4);
              lVar6 = lVar14;
              if (uVar20 < uVar3) {
                lVar6 = lVar13;
              }
              piVar17 = (int *)((ulong)uVar20 + lVar6);
              piVar15 = (int *)source;
              if (uVar20 < uVar3) {
                piVar15 = piVar39;
              }
              uVar25 = *puVar10 * -0x30e4432345000000 >> 0x34;
              *(uint *)((long)LZ4_dict + uVar24 * 4) = uVar27;
              iVar26 = 8;
              uVar24 = uVar25;
              if (uVar27 <= uVar20 + 0xffff) {
                if (*piVar17 == (int)*puVar30) {
                  iVar21 = uVar27 - uVar20;
                  iVar26 = 7;
                }
                else {
                  iVar26 = 0;
                }
              }
            }
            if ((iVar26 != 0) && (iVar26 != 8)) break;
            uVar20 = uVar22 >> 6;
            uVar22 = uVar22 + 1;
            puVar30 = puVar10;
          }
          if (iVar26 == 7) {
            iVar26 = 0;
          }
          if (iVar26 == 0) {
            iVar26 = (int)puVar30 - (int)puVar9;
            lVar6 = 0;
            uVar22 = iVar26 - 0xfU;
            cVar7 = (char)puVar30 * '\x10' + (char)puVar9 * -0x10;
            do {
              cVar28 = cVar7;
              uVar20 = uVar22;
              lVar36 = lVar6;
              piVar2 = (int *)((long)piVar17 + lVar36);
              puVar10 = (ulong *)((long)puVar30 + lVar36);
              if ((piVar2 <= piVar15) || (puVar10 <= puVar9)) break;
              lVar6 = lVar36 + -1;
              uVar22 = uVar20 - 1;
              cVar7 = cVar28 + -0x10;
            } while (*(char *)((long)puVar30 + lVar36 + -1) ==
                     *(char *)((long)piVar17 + lVar36 + -1));
            iVar5 = (int)lVar36;
            puVar30 = (ulong *)((long)local_d0 + 1);
            if ((uint)(iVar26 + iVar5) < 0xf) {
              *(char *)local_d0 = cVar28;
            }
            else {
              uVar25 = (ulong)(iVar26 - 0xfU) + lVar36;
              *(char *)local_d0 = -0x10;
              if (0xfe < (int)uVar25) {
                if (0x1fc < (int)uVar20) {
                  uVar20 = 0x1fd;
                }
                uVar22 = (iVar26 - uVar20) + iVar5 + 0xef;
                uVar25 = (ulong)uVar22 / 0xff;
                memset(puVar30,0xff,(ulong)(uVar22 / 0xff + 1));
                puVar30 = (ulong *)((long)local_d0 + uVar25 + 2);
                uVar25 = (ulong)(uint)(iVar26 + -0x10e + iVar5 + (int)uVar25 * -0xff);
              }
              *(char *)puVar30 = (char)uVar25;
              puVar30 = (ulong *)((long)puVar30 + 1);
            }
            puVar16 = (ulong *)((ulong)(uint)((int)puVar10 - (int)puVar9) + (long)puVar30);
            do {
              *puVar30 = *puVar9;
              puVar30 = puVar30 + 1;
              puVar9 = puVar9 + 1;
              piVar17 = piVar2;
              puVar34 = local_d0;
            } while (puVar30 < puVar16);
            do {
              *(short *)puVar16 = (short)iVar21;
              if (piVar15 == piVar39) {
                puVar9 = (ulong *)((lVar32 - (long)piVar17) + (long)puVar10);
                if (puVar8 < puVar9) {
                  puVar9 = puVar8;
                }
                puVar30 = (ulong *)((long)puVar10 + 4);
                puVar18 = (ulong *)(piVar17 + 1);
                puVar19 = puVar30;
                puVar35 = puVar18;
                if (puVar30 < (ulong *)((long)puVar9 - 7U)) {
                  uVar23 = *(ulong *)((long)puVar10 + 4) ^ *(ulong *)(piVar17 + 1);
                  uVar25 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar25 = uVar25 >> 3 & 0x1fffffff;
                  puVar19 = (ulong *)((long)puVar10 + 0xc);
                  puVar35 = (ulong *)(piVar17 + 3);
                  if (*(ulong *)(piVar17 + 1) == *(ulong *)((long)puVar10 + 4)) goto LAB_00113894;
                }
                else {
LAB_00113894:
                  do {
                    puVar18 = puVar35;
                    if ((ulong *)((long)puVar9 - 7U) <= puVar19) {
                      if ((puVar19 < (ulong *)((long)puVar9 - 3U)) &&
                         ((int)*puVar18 == (int)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 4);
                        puVar18 = (ulong *)((long)puVar18 + 4);
                      }
                      if ((puVar19 < (ulong *)((long)puVar9 - 1U)) &&
                         ((short)*puVar18 == (short)*puVar19)) {
                        puVar19 = (ulong *)((long)puVar19 + 2);
                        puVar18 = (ulong *)((long)puVar18 + 2);
                      }
                      if (puVar19 < puVar9) {
                        uVar25 = *puVar18;
                        puVar18 = (ulong *)CONCAT71((int7)((ulong)puVar18 >> 8),(char)uVar25);
                        puVar19 = (ulong *)((long)puVar19 + (ulong)((char)uVar25 == (char)*puVar19))
                        ;
                      }
                      uVar25 = (ulong)(uint)((int)puVar19 - (int)puVar30);
                      goto LAB_001138d4;
                    }
                    uVar25 = *puVar18;
                    uVar23 = *puVar19;
                    uVar33 = uVar23 ^ uVar25;
                    uVar4 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                      }
                    }
                    iVar26 = (int)puVar19;
                    puVar18 = puVar18 + 1;
                    puVar19 = puVar19 + 1;
                    puVar35 = puVar18;
                  } while (uVar25 == uVar23);
                  uVar25 = (ulong)((((uint)(uVar4 >> 3) & 0x1fffffff) + iVar26) - (int)puVar30);
                }
LAB_001138d4:
                puVar10 = (ulong *)((long)puVar10 + uVar25 + 4);
                if (puVar10 == puVar9) {
                  puVar19 = puVar9;
                  puVar30 = (ulong *)source;
                  if (puVar9 < puVar1) {
                    uVar23 = *(ulong *)source;
                    uVar4 = *puVar9;
                    uVar33 = 0;
                    if ((uVar4 ^ uVar23) != 0) {
                      for (; ((uVar4 ^ uVar23) >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                      }
                    }
                    puVar18 = (ulong *)(uVar33 >> 3 & 0x1fffffff);
                    uVar22 = (uint)puVar18;
                    if (uVar23 == uVar4) {
                      puVar30 = (ulong *)(source + (ulong)(uVar23 == uVar4) * 8);
                      puVar19 = puVar9 + (uVar23 == uVar4);
                      goto LAB_0011391f;
                    }
                  }
                  else {
LAB_0011391f:
                    do {
                      if (puVar1 <= puVar19) {
                        if ((puVar19 < puVar29) && ((int)*puVar30 == (int)*puVar19)) {
                          puVar19 = (ulong *)((long)puVar19 + 4);
                          puVar30 = (ulong *)((long)puVar30 + 4);
                        }
                        if ((puVar19 < puVar37) && ((short)*puVar30 == (short)*puVar19)) {
                          puVar19 = (ulong *)((long)puVar19 + 2);
                          puVar30 = (ulong *)((long)puVar30 + 2);
                        }
                        if (puVar19 < puVar8) {
                          puVar19 = (ulong *)((long)puVar19 +
                                             (ulong)((char)*puVar30 == (char)*puVar19));
                        }
                        uVar22 = (int)puVar19 - (int)puVar9;
                        break;
                      }
                      uVar23 = *puVar30;
                      uVar33 = *puVar19 ^ uVar23;
                      uVar4 = 0;
                      if (uVar33 != 0) {
                        for (; (uVar33 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                        }
                      }
                      puVar35 = (ulong *)((uVar4 >> 3 & 0x1fffffff) + (long)puVar19);
                      puVar30 = puVar30 + 1;
                      bVar41 = uVar23 == *puVar19;
                      puVar19 = puVar19 + 1;
                      if (!bVar41) {
                        puVar19 = puVar35;
                      }
                      puVar18 = (ulong *)((ulong)puVar18 & 0xffffffff);
                      if (!bVar41) {
                        puVar18 = (ulong *)(ulong)(uint)((int)puVar35 - (int)puVar9);
                      }
                      uVar22 = (uint)puVar18;
                    } while (bVar41);
                  }
                  uVar25 = (ulong)((int)uVar25 + uVar22);
                  puVar10 = (ulong *)((long)puVar10 + (ulong)uVar22);
                }
              }
              else {
                puVar9 = (ulong *)((long)puVar10 + 4);
                puVar30 = (ulong *)(piVar17 + 1);
                puVar18 = puVar9;
                if (puVar9 < puVar1) {
                  uVar23 = *(ulong *)((long)puVar10 + 4) ^ *(ulong *)(piVar17 + 1);
                  uVar25 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar25 = uVar25 >> 3 & 0x1fffffff;
                  puVar18 = (ulong *)((long)puVar10 + 0xc);
                  puVar30 = (ulong *)(piVar17 + 3);
                  if (*(ulong *)(piVar17 + 1) == *(ulong *)((long)puVar10 + 4)) goto LAB_001137eb;
                }
                else {
LAB_001137eb:
                  do {
                    if (puVar1 <= puVar18) {
                      if ((puVar18 < puVar29) && ((int)*puVar30 == (int)*puVar18)) {
                        puVar18 = (ulong *)((long)puVar18 + 4);
                        puVar30 = (ulong *)((long)puVar30 + 4);
                      }
                      if ((puVar18 < puVar37) && ((short)*puVar30 == (short)*puVar18)) {
                        puVar18 = (ulong *)((long)puVar18 + 2);
                        puVar30 = (ulong *)((long)puVar30 + 2);
                      }
                      if (puVar18 < puVar8) {
                        puVar18 = (ulong *)((long)puVar18 +
                                           (ulong)((char)*puVar30 == (char)*puVar18));
                      }
                      uVar25 = (ulong)(uint)((int)puVar18 - (int)puVar9);
                      goto LAB_00113826;
                    }
                    uVar25 = *puVar30;
                    uVar23 = *puVar18;
                    uVar33 = uVar23 ^ uVar25;
                    uVar4 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                      }
                    }
                    iVar26 = (int)puVar18;
                    puVar30 = puVar30 + 1;
                    puVar18 = puVar18 + 1;
                  } while (uVar25 == uVar23);
                  uVar25 = (ulong)((((uint)(uVar4 >> 3) & 0x1fffffff) + iVar26) - (int)puVar9);
                }
LAB_00113826:
                puVar10 = (ulong *)((long)puVar10 + uVar25 + 4);
              }
              local_d0 = (ulong *)((long)puVar16 + 2);
              uVar22 = (uint)uVar25;
              if (uVar22 < 0xf) {
                *(char *)puVar34 = (char)*puVar34 + (char)uVar25;
              }
              else {
                *(char *)puVar34 = (char)*puVar34 + '\x0f';
                uVar20 = uVar22 - 0xf;
                *(undefined4 *)local_d0 = 0xffffffff;
                if (0x3fb < uVar20) {
                  uVar22 = uVar22 - 0x40b;
                  memset((char *)((long)puVar16 + 6),0xff,(ulong)((uVar22 / 0x3fc) * 4 + 4));
                  uVar20 = uVar22 % 0x3fc;
                  local_d0 = (ulong *)((long)puVar16 + (ulong)((uVar22 / 0x3fc) * 4) + 6);
                }
                pcVar12 = (char *)((long)local_d0 + (ulong)uVar20 / 0xff);
                local_d0 = (ulong *)(pcVar12 + 1);
                *pcVar12 = (char)((ulong)uVar20 * 0x8080808081 >> 0x27);
              }
              puVar9 = puVar10;
              if ((char *)((long)piVar40 + (long)source) + -0xb <= puVar10) {
                iVar26 = 3;
                puVar30 = puVar10;
                goto LAB_00113bf6;
              }
              *(int *)((long)LZ4_dict +
                      ((ulong)(*(long *)((long)puVar10 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)puVar10 + -2) - iVar38;
              uVar25 = *puVar10 * -0x30e4432345000000 >> 0x34;
              uVar20 = (int)puVar10 - iVar38;
              uVar22 = *(uint *)((long)LZ4_dict + uVar25 * 4);
              lVar6 = lVar14;
              if (uVar22 < uVar3) {
                lVar6 = lVar13;
              }
              piVar17 = (int *)((ulong)uVar22 + lVar6);
              piVar15 = (int *)source;
              if (uVar22 < uVar3) {
                piVar15 = piVar39;
              }
              *(uint *)((long)LZ4_dict + uVar25 * 4) = uVar20;
              bVar41 = true;
              if ((uVar20 <= uVar22 + 0xffff) && (*piVar17 == (int)*puVar10)) {
                *(char *)local_d0 = '\0';
                iVar21 = uVar20 - uVar22;
                bVar41 = false;
                puVar34 = local_d0;
                local_d0 = (ulong *)((long)local_d0 + 1);
              }
              puVar16 = local_d0;
            } while (!bVar41);
            uVar24 = (ulong)(*(long *)((long)puVar10 + 1) * -0x30e4432345000000) >> 0x34;
            iVar26 = 0;
            puVar30 = (ulong *)((long)puVar10 + 1);
          }
LAB_00113bf6:
        } while (iVar26 == 0);
joined_r0x00113c04:
        if (1 < iVar26 - 2U) goto LAB_00113485;
      }
LAB_00113c19:
      uVar24 = (long)((long)piVar40 + (long)source) - (long)puVar9;
      if (uVar24 < 0xf) {
        *(char *)local_d0 = (char)uVar24 << 4;
      }
      else {
        uVar25 = uVar24 - 0xf;
        *(char *)local_d0 = -0x10;
        puVar8 = (ulong *)((long)local_d0 + 1);
        if (0xfe < uVar25) {
          uVar23 = (uVar24 - 0x10e) / 0xff;
          memset((ulong *)((long)local_d0 + 1),0xff,uVar23 + 1);
          uVar25 = (uVar24 + uVar23 * -0xff) - 0x10e;
          puVar8 = (ulong *)((long)local_d0 + uVar23 + 2);
        }
        local_d0 = puVar8;
        *(char *)local_d0 = (char)uVar25;
      }
      memcpy((char *)((long)local_d0 + 1),puVar9,uVar24);
      local_60 = (int)dest;
      local_60 = ((int)(char *)((long)local_d0 + 1) + (int)uVar24) - local_60;
      goto LAB_00113cb7;
    }
  }
LAB_00113485:
  local_60 = 0;
LAB_00113cb7:
  (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return local_60;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}